

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O0

ans_int_encode * ans_int_encode::create(uint32_t *in_u32,size_t n)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  int iVar1;
  uint32_t uVar2;
  uint *puVar3;
  reference pvVar4;
  iterator this;
  reference pvVar5;
  reference pvVar6;
  ulong in_RDX;
  long in_RSI;
  ans_int_encode *in_RDI;
  size_t sym;
  uint64_t tmp;
  uint64_t cur_base;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000078;
  size_t i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  size_t i;
  uint32_t max_sym;
  ans_int_encode *model;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffef8;
  value_type in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  allocator_type *in_stack_ffffffffffffff08;
  long lVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff20;
  ulong local_a8;
  long local_a0;
  ulong local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  ulong local_28;
  uint local_20;
  byte local_19;
  ulong local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ans_int_encode((ans_int_encode *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_20 = 0;
  for (local_28 = 0; local_28 < local_18; local_28 = local_28 + 1) {
    puVar3 = std::max<unsigned_int>((uint *)(local_10 + local_28 * 4),&local_20);
    local_20 = *puVar3;
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x18a7a1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
             ,(value_type_conflict2 *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x18a7cf);
  for (local_68 = 0; local_68 < local_18; local_68 = local_68 + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_40,(ulong)*(uint *)(local_10 + local_68 * 4));
    *pvVar4 = *pvVar4 + 1;
  }
  adjust_freqs(in_stack_00000078,cur_base._4_4_,cur_base._3_1_,tmp._4_4_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_ffffffffffffff10,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff08);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff10);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffef8._M_current);
  this = std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                   (in_stack_fffffffffffffef8._M_current);
  __first._M_current._4_4_ = in_stack_ffffffffffffff04;
  __first._M_current._0_4_ = in_stack_ffffffffffffff00;
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (__first,in_stack_fffffffffffffef8,0);
  in_RDI->frame_size = (long)iVar1;
  uVar2 = 0;
  local_a0 = 0x1000000000;
  std::vector<enc_entry_int,_std::allocator<enc_entry_int>_>::resize
            ((vector<enc_entry_int,_std::allocator<enc_entry_int>_> *)this._M_current,
             CONCAT44(iVar1,in_stack_ffffffffffffff18));
  for (local_a8 = 0; local_a8 <= local_20; local_a8 = local_a8 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&in_RDI->nfreqs,local_a8);
    if (*pvVar5 != 0) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->nfreqs,local_a8);
      in_stack_ffffffffffffff00 = *pvVar5;
      pvVar6 = std::vector<enc_entry_int,_std::allocator<enc_entry_int>_>::operator[]
                         (&in_RDI->table,local_a8);
      pvVar6->freq = in_stack_ffffffffffffff00;
      in_stack_ffffffffffffff04 = uVar2;
      pvVar6 = std::vector<enc_entry_int,_std::allocator<enc_entry_int>_>::operator[]
                         (&in_RDI->table,local_a8);
      pvVar6->base = in_stack_ffffffffffffff04;
      lVar7 = local_a0;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->nfreqs,local_a8);
      in_stack_ffffffffffffff10 =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar7 * (ulong)*pvVar5);
      pvVar6 = std::vector<enc_entry_int,_std::allocator<enc_entry_int>_>::operator[]
                         (&in_RDI->table,local_a8);
      pvVar6->sym_upper_bound = (uint64_t)in_stack_ffffffffffffff10;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&in_RDI->nfreqs,local_a8);
      uVar2 = *pvVar5 + uVar2;
    }
  }
  in_RDI->lower_bound = in_RDI->frame_size << 4;
  local_19 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10);
  if ((local_19 & 1) == 0) {
    ~ans_int_encode((ans_int_encode *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))
    ;
  }
  return in_RDI;
}

Assistant:

static ans_int_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_int_encode model;
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            max_sym = std::max(in_u32[i], max_sym);
        }
        std::vector<uint64_t> freqs(max_sym + 1, 0);
        for (size_t i = 0; i < n; i++) {
            freqs[in_u32[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, false);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;

        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym <= max_sym; sym++) {
            if (model.nfreqs[sym] == 0)
                continue;
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }